

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O1

ConstantExpression * __thiscall
COLLADASaxFWL::FormulasLoader::createConstant(FormulasLoader *this,String *value)

{
  bool bVar1;
  ConstantExpression *this_00;
  bool failed;
  bool local_19;
  
  this_00 = (ConstantExpression *)operator_new(0x40);
  MathML::AST::ConstantExpression::ConstantExpression(this_00,value);
  local_19 = false;
  GeneratedSaxParser::Utils::toDouble((value->_M_dataplus)._M_p,&local_19);
  if (local_19 == false) {
    (*(this_00->super_INode)._vptr_INode[6])(this_00);
  }
  else {
    bVar1 = GeneratedSaxParser::Utils::toBool((value->_M_dataplus)._M_p,&local_19);
    if (local_19 == false) {
      (*(this_00->super_INode)._vptr_INode[8])(this_00,(ulong)bVar1);
    }
  }
  return this_00;
}

Assistant:

MathML::AST::ConstantExpression* FormulasLoader::createConstant( const String& value )
	{
		MathML::AST::ConstantExpression* constant = FW_NEW MathML::AST::ConstantExpression( value );

		bool failed = false;
		double doubleValue = GeneratedSaxParser::Utils::toDouble( value.c_str(), failed );
		if ( !failed )
		{
			constant->setValue( doubleValue );
		}
		else
		{
			bool boolValue = GeneratedSaxParser::Utils::toBool( value.c_str(), failed );
			if ( !failed )
			{
				constant->setValue( boolValue );
			}
		}

		return constant;
	}